

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zero_copy_stream_impl_lite.cc
# Opt level: O2

void __thiscall google::protobuf::io::ArrayInputStream::BackUp(ArrayInputStream *this,int count)

{
  string *psVar1;
  size_type sVar2;
  pointer pcVar3;
  undefined8 uStack_30;
  LogMessage local_20 [16];
  
  psVar1 = absl::lts_20240722::log_internal::Check_GTImpl_abi_cxx11_
                     (this->last_returned_size_,0,"last_returned_size_ > 0");
  if (psVar1 != (string *)0x0) {
    absl::lts_20240722::log_internal::LogMessageFatal::LogMessageFatal
              ((LogMessageFatal *)local_20,
               "/workspace/llm4binary/github/license_c_cmakelists/pybind[P]pybind11_protobuf/build_O2/_deps/protobuf-src/src/google/protobuf/io/zero_copy_stream_impl_lite.cc"
               ,0x3e,psVar1->_M_string_length,(psVar1->_M_dataplus)._M_p);
    absl::lts_20240722::log_internal::LogMessage::operator<<
              (local_20,(char (*) [55])"BackUp() can only be called after a successful Next().");
    absl::lts_20240722::log_internal::LogMessageFatal::~LogMessageFatal((LogMessageFatal *)local_20)
    ;
  }
  psVar1 = absl::lts_20240722::log_internal::Check_LEImpl_abi_cxx11_
                     (count,this->last_returned_size_,"count <= last_returned_size_");
  if (psVar1 == (string *)0x0) {
    psVar1 = absl::lts_20240722::log_internal::Check_GEImpl_abi_cxx11_(count,0,"count >= 0");
    if (psVar1 == (string *)0x0) {
      this->position_ = this->position_ - count;
      this->last_returned_size_ = 0;
      return;
    }
    pcVar3 = (psVar1->_M_dataplus)._M_p;
    sVar2 = psVar1->_M_string_length;
    uStack_30 = 0x41;
  }
  else {
    pcVar3 = (psVar1->_M_dataplus)._M_p;
    sVar2 = psVar1->_M_string_length;
    uStack_30 = 0x40;
  }
  absl::lts_20240722::log_internal::LogMessageFatal::LogMessageFatal
            ((LogMessageFatal *)local_20,
             "/workspace/llm4binary/github/license_c_cmakelists/pybind[P]pybind11_protobuf/build_O2/_deps/protobuf-src/src/google/protobuf/io/zero_copy_stream_impl_lite.cc"
             ,uStack_30,sVar2,pcVar3);
  absl::lts_20240722::log_internal::LogMessageFatal::~LogMessageFatal((LogMessageFatal *)local_20);
}

Assistant:

void ArrayInputStream::BackUp(int count) {
  ABSL_CHECK_GT(last_returned_size_, 0)
      << "BackUp() can only be called after a successful Next().";
  ABSL_CHECK_LE(count, last_returned_size_);
  ABSL_CHECK_GE(count, 0);
  position_ -= count;
  last_returned_size_ = 0;  // Don't let caller back up further.
}